

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int get_line_infos(char *buf,size_t buf_len,LineInfo **line_infos,size_t *num_lines)

{
  int iVar1;
  LineInfo *pLVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long *in_FS_OFFSET;
  long local_70;
  
  uVar3 = 0;
  for (sVar5 = 0; buf_len != sVar5; sVar5 = sVar5 + 1) {
    iVar1 = is_line_ending(buf,sVar5,buf_len);
    if (iVar1 != 0) {
      *num_lines = *num_lines + 1;
      uVar3 = sVar5;
    }
  }
  sVar5 = *num_lines;
  if (uVar3 != buf_len) {
    sVar5 = sVar5 + 1;
    *num_lines = sVar5;
  }
  if (sVar5 == 0) {
    return -1;
  }
  pLVar2 = (LineInfo *)(*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,1);
  *line_infos = pLVar2;
  sVar5 = 0;
  local_70 = 0;
  do {
    sVar4 = 0;
    while( true ) {
      if (buf_len - sVar5 == sVar4) {
        if (uVar3 == buf_len) {
          return 0;
        }
        pLVar2[local_70].pos = sVar5;
        pLVar2[local_70].len = ~uVar3 + buf_len;
        return 0;
      }
      iVar1 = is_line_ending(buf,sVar4 + sVar5,buf_len);
      if (iVar1 != 0) break;
      sVar4 = sVar4 + 1;
    }
    pLVar2[local_70].pos = sVar5;
    pLVar2[local_70].len = sVar4;
    sVar5 = sVar5 + sVar4 + 1;
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

static int get_line_infos(const char *buf, size_t buf_len, LineInfo **line_infos, size_t *num_lines)
{
  size_t i = 0;
  size_t end_idx = buf_len;
  size_t prev_pos = 0;
  size_t line_no = 0;
  size_t last_line_ending = 0;

  /* Count # of lines. */
  for (i = 0; i < end_idx; i++) {
    if (is_line_ending(buf, i, end_idx)) {
      (*num_lines)++;
      last_line_ending = i;
    }
  }
  /* The last char from the input may not be a line
    * ending character so add an extra line if there
    * are more characters after the last line ending
    * that was found. */
  if (end_idx - last_line_ending > 0) {
      (*num_lines)++;
  }

  if (*num_lines == 0) return TINYOBJ_ERROR_EMPTY;

  *line_infos = (LineInfo *)TINYOBJ_MALLOC(sizeof(LineInfo) * (*num_lines));

  /* Fill line infos. */
  for (i = 0; i < end_idx; i++) {
    if (is_line_ending(buf, i, end_idx)) {
      (*line_infos)[line_no].pos = prev_pos;
      (*line_infos)[line_no].len = i - prev_pos;
      prev_pos = i + 1;
      line_no++;
    }
  }
  if (end_idx - last_line_ending > 0) {
    (*line_infos)[line_no].pos = prev_pos;
    (*line_infos)[line_no].len = end_idx - 1 - last_line_ending;
  }

  return 0;
}